

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O2

void __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::AddChunk
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,size_t capacity)

{
  CrtAllocator *this_00;
  ChunkHeader *pCVar1;
  
  this_00 = this->baseAllocator_;
  if (this_00 == (CrtAllocator *)0x0) {
    this_00 = (CrtAllocator *)operator_new(1);
    this->baseAllocator_ = this_00;
    this->ownBaseAllocator_ = this_00;
  }
  pCVar1 = (ChunkHeader *)CrtAllocator::Malloc(this_00,capacity + 0x18);
  pCVar1->capacity = capacity;
  pCVar1->size = 0;
  pCVar1->next = this->chunkHead_;
  this->chunkHead_ = pCVar1;
  return;
}

Assistant:

void AddChunk(size_t capacity) {
        if (!baseAllocator_)
            ownBaseAllocator_ = baseAllocator_ = RAPIDJSON_NEW(BaseAllocator());
        ChunkHeader* chunk = reinterpret_cast<ChunkHeader*>(baseAllocator_->Malloc(sizeof(ChunkHeader) + capacity));
        chunk->capacity = capacity;
        chunk->size = 0;
        chunk->next = chunkHead_;
        chunkHead_ =  chunk;
    }